

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_manager.cpp
# Opt level: O2

shared_ptr<duckdb::BlockHandle,_true> __thiscall
duckdb::BlockManager::RegisterBlock(BlockManager *this,block_id_t block_id)

{
  iterator iVar1;
  mapped_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::BlockHandle,_true> sVar2;
  MemoryTag local_40 [8];
  weak_ptr<duckdb::BlockHandle,_true> local_38;
  
  ::std::mutex::lock((mutex *)&((pthread_mutex_t *)(block_id + 0x10))->__data);
  iVar1 = ::std::
          _Hashtable<long,_std::pair<const_long,_duckdb::weak_ptr<duckdb::BlockHandle,_true>_>,_std::allocator<std::pair<const_long,_duckdb::weak_ptr<duckdb::BlockHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<long,_std::pair<const_long,_duckdb::weak_ptr<duckdb::BlockHandle,_true>_>,_std::allocator<std::pair<const_long,_duckdb::weak_ptr<duckdb::BlockHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(block_id + 0x38),(key_type_conflict2 *)local_40);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_long,_duckdb::weak_ptr<duckdb::BlockHandle,_true>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    weak_ptr<duckdb::BlockHandle,_true>::lock((weak_ptr<duckdb::BlockHandle,_true> *)this);
    if (this->_vptr_BlockManager != (_func_int **)0x0) goto LAB_014b45c2;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->buffer_manager);
  }
  local_38.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
       (__weak_ptr<duckdb::BlockHandle,(__gnu_cxx::_Lock_policy)2>)0x0;
  make_shared_ptr<duckdb::BlockHandle,duckdb::BlockManager&,long&,duckdb::MemoryTag>
            (this,(long *)block_id,local_40);
  ::std::__weak_ptr<duckdb::BlockHandle,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<duckdb::BlockHandle,void>
            ((__weak_ptr<duckdb::BlockHandle,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2> *)this);
  this_00 = ::std::__detail::
            _Map_base<long,_std::pair<const_long,_duckdb::weak_ptr<duckdb::BlockHandle,_true>_>,_std::allocator<std::pair<const_long,_duckdb::weak_ptr<duckdb::BlockHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<long,_std::pair<const_long,_duckdb::weak_ptr<duckdb::BlockHandle,_true>_>,_std::allocator<std::pair<const_long,_duckdb::weak_ptr<duckdb::BlockHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)(block_id + 0x38),(key_type *)local_40);
  weak_ptr<duckdb::BlockHandle,_true>::operator=(this_00,&local_38);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&local_38.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
LAB_014b45c2:
  pthread_mutex_unlock((pthread_mutex_t *)(block_id + 0x10));
  sVar2.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::BlockHandle,_true>)
         sVar2.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BlockHandle> BlockManager::RegisterBlock(block_id_t block_id) {
	lock_guard<mutex> lock(blocks_lock);
	// check if the block already exists
	auto entry = blocks.find(block_id);
	if (entry != blocks.end()) {
		// already exists: check if it hasn't expired yet
		auto existing_ptr = entry->second.lock();
		if (existing_ptr) {
			//! it hasn't! return it
			return existing_ptr;
		}
	}
	// create a new block pointer for this block
	auto result = make_shared_ptr<BlockHandle>(*this, block_id, MemoryTag::BASE_TABLE);
	// register the block pointer in the set of blocks as a weak pointer
	blocks[block_id] = weak_ptr<BlockHandle>(result);
	return result;
}